

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O1

void anon_unknown.dwarf_538ca::testMatrix(M33f *M)

{
  float __x;
  bool bVar1;
  ostream *poVar2;
  float (*v) [3];
  long lVar3;
  long lVar4;
  float fVar5;
  float r;
  float h;
  M33f N;
  float local_a0;
  float local_9c;
  Vec2<float> local_98;
  Vec2<float> local_90;
  Matrix33<float> local_88;
  Matrix33<float> local_58;
  
  lVar4 = 0;
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_90.x = 0.0;
  local_90.y = 0.0;
  local_a0 = 0.0;
  bVar1 = Imath_2_5::extractSHRT<float>(M,&local_98,&local_9c,&local_a0,&local_90,true);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::endl<char,std::char_traits<char>>(poVar2);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                  ,0x4f,"void (anonymous namespace)::testMatrix(const M33f)");
  }
  local_58.x[0][2] = 0.0;
  local_58.x[1][0] = 0.0;
  local_58.x[2][0] = 0.0;
  local_58.x[2][1] = 0.0;
  local_58.x[0][0] = 1.0;
  local_58.x[0][1] = 0.0;
  local_58.x[1][1] = 1.0;
  local_58.x[1][2] = 0.0;
  local_58.x[2][2] = 1.0;
  local_88.x[0][2] = 0.0;
  local_88.x[1][0] = 0.0;
  local_88.x[1][2] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[0]._0_8_ = (ulong)local_98 & 0xffffffff;
  local_88.x[1][1] = local_98.y;
  local_88.x[2][2] = 1.0;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,&local_88);
  local_88.x[2][2] = 1.0;
  local_88.x[0][0] = 1.0;
  local_88.x[0][1] = 0.0;
  local_88.x._8_8_ = (ulong)(uint)local_9c << 0x20;
  local_88.x[1][1] = 1.0;
  local_88.x[1][2] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,&local_88);
  __x = local_a0;
  local_88.x[0][2] = 0.0;
  local_88.x[1][0] = 0.0;
  local_88.x[1][2] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[0][0] = 1.0;
  local_88.x[0][1] = 0.0;
  local_88.x[1][1] = 1.0;
  local_88.x[2][2] = 1.0;
  fVar5 = cosf(local_a0);
  local_88.x[0][1] = sinf(__x);
  local_88.x[0][0] = fVar5;
  local_88.x._8_8_ = (ulong)(uint)local_88.x[0][1] << 0x20 ^ 0x8000000000000000;
  local_88.x[1][2] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[2][2] = 1.0;
  local_88.x[1][1] = fVar5;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,&local_88);
  local_88.x[2][2] = 1.0;
  local_88.x[0][0] = 1.0;
  local_88.x[0][1] = 0.0;
  local_88.x[0][2] = 0.0;
  local_88.x[1][0] = 0.0;
  local_88.x[2][0] = local_90.x;
  local_88.x[2][1] = local_90.y;
  local_88.x[1][1] = 1.0;
  local_88.x[1][2] = 0.0;
  v = (float (*) [3])&local_88;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,(Matrix33<float> *)v);
  local_88.x[0][1] = M->x[0][1] - local_58.x[0][1];
  local_88.x[0][0] = M->x[0][0] - local_58.x[0][0];
  local_88.x[1][0] = M->x[1][0] - local_58.x[1][0];
  local_88.x[0][2] = M->x[0][2] - local_58.x[0][2];
  local_88.x[1][1] = M->x[1][1] - local_58.x[1][1];
  local_88.x[1][2] = M->x[1][2] - local_58.x[1][2];
  local_88.x[2][0] = M->x[2][0] - local_58.x[2][0];
  local_88.x[2][1] = M->x[2][1] - local_58.x[2][1];
  local_88.x[2][2] = M->x[2][2] - local_58.x[2][2];
  do {
    lVar3 = 0;
    do {
      if (1e-05 < ABS((*(float (*) [3])*v)[lVar3])) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*v)[lVar3]);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar2 = Imath_2_5::operator<<(poVar2,M);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar2 = Imath_2_5::operator<<(poVar2,&local_58);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar2 = Imath_2_5::operator<<(poVar2,&local_88);
        std::endl<char,std::char_traits<char>>(poVar2);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                      ,0x75,"void (anonymous namespace)::testMatrix(const M33f)");
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar4 = lVar4 + 1;
    v = v + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

void
testMatrix (const M33f M)
{
    //
    // Extract the rotation angle from M, and convert the
    // angle back to a matrix, N.
    //

    V2f s(0.f), t(0.f);
    float h, r= 0.f;
  
    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert(false);
    }

    M33f N;

    N *= M33f().setScale (s);
    N *= M33f().setShear (h);
    N *= M33f().setRotation (r);
    N *= M33f().setTranslation (t);

    debug (("Re-scale: %f %f\n", s[0], s[1]));
    debug (("Re-shear: %f\n", h));
    debug (("Re-rot  : %f\n", r));
    debug (("Re-trans: %f %f\n", t[0], t[1]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M33f D (M - N);

    for (int j = 0; j < 3; ++j)
    {
	for (int k = 0; k < 3; ++k)
	{
	    if (abs (D[j][k]) > 0.00001)
	    {
		cout << "unexpectedly large matrix to "
			"euler angles conversion error: " <<
			D[j][k] << endl;

		cout << j << " " << k << endl;

		cout << "M\n" << M << endl;
		cout << "N\n" << N << endl;
		cout << "D\n" << D << endl;

		assert (false);
	    }
	}
    }
}